

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float __thiscall
pbrt::TrowbridgeReitzDistribution::PDF(TrowbridgeReitzDistribution *this,Vector3f wo,Vector3f wm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined8 in_XMM2_Qb;
  Tuple3<pbrt::Vector3,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  local_38.z = wm.super_Tuple3<pbrt::Vector3,_float>.z;
  local_28.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._8_56_ = wo._8_56_;
  auVar6._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_28._0_8_ = vmovlps_avx(auVar6._0_16_);
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = wm.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_38._0_8_ = vmovlps_avx(auVar1);
  FVar3 = D(this,(Vector3f *)&local_38);
  FVar4 = G1(this,(Vector3f *)&local_28);
  fVar5 = AbsDot<float>((Vector3<float> *)&local_28,(Vector3<float> *)&local_38);
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx512vl(ZEXT416((uint)local_28.z),auVar2);
  return (fVar5 * FVar4 * FVar3) / auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wm) const {
        return D(wm) * G1(wo) * AbsDot(wo, wm) / AbsCosTheta(wo);
    }